

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GSPriorityFloodClass.cpp
# Opt level: O0

Boolean __thiscall GSFloodFill<unsigned_char>::Transform(GSFloodFill<unsigned_char> *this)

{
  int iVar1;
  uchar **ppuVar2;
  undefined1 auVar3 [16];
  XY_t xy_00;
  bool bVar4;
  Boolean BVar5;
  ulong uVar6;
  Boolean **ppBVar7;
  Boolean *pBVar8;
  ostream *poVar9;
  size_type sVar10;
  pointer ppVar11;
  reference __p;
  size_type sVar12;
  XY_t XVar13;
  reference ppVar14;
  uchar *puVar15;
  pointer ppVar16;
  byte local_2a1;
  pair<double,_std::pair<int,_int>_> local_198;
  XY_t local_188;
  XY_t local_180;
  XY_t n;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_170;
  iterator nit;
  int local_150;
  int iStack_14c;
  XY_t miNeighbor;
  _Self local_130;
  _Base_ptr local_128;
  _Base_ptr local_120;
  pair<unsigned_char,_std::pair<int,_int>_> local_118;
  int local_10c;
  pair<int,_int> local_108;
  _Base_ptr local_100;
  pair<unsigned_char,_std::pair<int,_int>_> local_f8;
  int local_ec;
  pair<int,_int> local_e8;
  _Base_ptr local_e0;
  pair<unsigned_char,_std::pair<int,_int>_> local_d8;
  int local_cc;
  pair<int,_int> local_c8;
  _Base_ptr local_c0;
  pair<unsigned_char,_std::pair<int,_int>_> local_b8;
  int local_ac;
  pair<int,_int> local_a8;
  _Base_ptr local_a0;
  pair<unsigned_char,_std::pair<int,_int>_> local_94;
  int local_88 [2];
  pair<int,_int> local_80;
  _Base_ptr local_78;
  pair<unsigned_char,_std::pair<int,_int>_> local_70;
  int local_64 [2];
  pair<int,_int> local_5c [2];
  undefined1 local_48 [8];
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> neighbors;
  PrIterator_t it;
  XY_t c;
  XY_t xy;
  int j;
  int i;
  GSFloodFill<unsigned_char> *this_local;
  
  std::pair<int,_int>::pair<int,_int,_true>(&c);
  std::pair<int,_int>::pair<int,_int,_true>((pair<int,_int> *)&it);
  std::_Rb_tree_iterator<std::pair<const_unsigned_char,_std::pair<int,_int>_>_>::_Rb_tree_iterator
            ((_Rb_tree_iterator<std::pair<const_unsigned_char,_std::pair<int,_int>_>_> *)
             &neighbors.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_48);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)this->rows;
  uVar6 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  ppBVar7 = (Boolean **)operator_new__(uVar6);
  this->Closed = ppBVar7;
  for (xy.second = 0; xy.second < this->rows; xy.second = xy.second + 1) {
    pBVar8 = (Boolean *)operator_new__((long)this->cols);
    this->Closed[xy.second] = pBVar8;
    for (xy.first = 0; xy.first < this->cols; xy.first = xy.first + 1) {
      this->Closed[xy.second][xy.first] = false;
    }
  }
  if (this->rows == 1) {
    local_64[1] = 0;
    local_64[0] = 0;
    std::pair<int,_int>::pair<int,_int,_true>(local_5c,local_64 + 1,local_64);
    std::pair<int,_int>::operator=(&c,local_5c);
    std::pair<unsigned_char,_std::pair<int,_int>_>::
    pair<unsigned_char_&,_std::pair<int,_int>_&,_true>(&local_70,*this->dem,&c);
    local_78 = (_Base_ptr)
               std::
               multimap<unsigned_char,std::pair<int,int>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
               ::insert<std::pair<unsigned_char,std::pair<int,int>>>
                         ((multimap<unsigned_char,std::pair<int,int>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
                           *)&this->Open,&local_70);
    **this->Closed = true;
    local_88[1] = 0;
    local_88[0] = this->cols + -1;
    std::pair<int,_int>::pair<int,_int,_true>(&local_80,local_88 + 1,local_88);
    std::pair<int,_int>::operator=(&c,&local_80);
    std::pair<unsigned_char,_std::pair<int,_int>_>::
    pair<unsigned_char_&,_std::pair<int,_int>_&,_true>(&local_94,*this->dem + (this->cols + -1),&c);
    local_a0 = (_Base_ptr)
               std::
               multimap<unsigned_char,std::pair<int,int>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
               ::insert<std::pair<unsigned_char,std::pair<int,int>>>
                         ((multimap<unsigned_char,std::pair<int,int>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
                           *)&this->Open,&local_94);
    (*this->Closed)[this->cols + -1] = true;
  }
  else {
    for (xy.first = 0; xy.first < this->cols; xy.first = xy.first + 1) {
      local_ac = 0;
      std::pair<int,_int>::pair<int,_int_&,_true>(&local_a8,&local_ac,&xy.first);
      std::pair<int,_int>::operator=(&c,&local_a8);
      std::pair<unsigned_char,_std::pair<int,_int>_>::
      pair<unsigned_char_&,_std::pair<int,_int>_&,_true>(&local_b8,*this->dem + xy.first,&c);
      local_c0 = (_Base_ptr)
                 std::
                 multimap<unsigned_char,std::pair<int,int>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
                 ::insert<std::pair<unsigned_char,std::pair<int,int>>>
                           ((multimap<unsigned_char,std::pair<int,int>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
                             *)&this->Open,&local_b8);
      (*this->Closed)[xy.first] = true;
      local_cc = this->rows + -1;
      std::pair<int,_int>::pair<int,_int_&,_true>(&local_c8,&local_cc,&xy.first);
      std::pair<int,_int>::operator=(&c,&local_c8);
      std::pair<unsigned_char,_std::pair<int,_int>_>::
      pair<unsigned_char_&,_std::pair<int,_int>_&,_true>
                (&local_d8,this->dem[this->rows + -1] + xy.first,&c);
      local_e0 = (_Base_ptr)
                 std::
                 multimap<unsigned_char,std::pair<int,int>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
                 ::insert<std::pair<unsigned_char,std::pair<int,int>>>
                           ((multimap<unsigned_char,std::pair<int,int>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
                             *)&this->Open,&local_d8);
      this->Closed[this->rows + -1][xy.first] = true;
    }
    for (xy.second = 1; xy.second < this->rows + -1; xy.second = xy.second + 1) {
      local_ec = 0;
      std::pair<int,_int>::pair<int_&,_int,_true>(&local_e8,&xy.second,&local_ec);
      std::pair<int,_int>::operator=(&c,&local_e8);
      std::pair<unsigned_char,_std::pair<int,_int>_>::
      pair<unsigned_char_&,_std::pair<int,_int>_&,_true>(&local_f8,this->dem[xy.second],&c);
      local_100 = (_Base_ptr)
                  std::
                  multimap<unsigned_char,std::pair<int,int>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
                  ::insert<std::pair<unsigned_char,std::pair<int,int>>>
                            ((multimap<unsigned_char,std::pair<int,int>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
                              *)&this->Open,&local_f8);
      *this->Closed[xy.second] = true;
      local_10c = this->cols + -1;
      std::pair<int,_int>::pair<int_&,_int,_true>(&local_108,&xy.second,&local_10c);
      std::pair<int,_int>::operator=(&c,&local_108);
      std::pair<unsigned_char,_std::pair<int,_int>_>::
      pair<unsigned_char_&,_std::pair<int,_int>_&,_true>
                (&local_118,this->dem[xy.second] + (this->cols + -1),&c);
      local_120 = (_Base_ptr)
                  std::
                  multimap<unsigned_char,std::pair<int,int>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
                  ::insert<std::pair<unsigned_char,std::pair<int,int>>>
                            ((multimap<unsigned_char,std::pair<int,int>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
                              *)&this->Open,&local_118);
      this->Closed[xy.second][this->cols + -1] = true;
    }
  }
  if (this->verbose != 0) {
    poVar9 = std::operator<<((ostream *)&std::cout,"Number of edges: ");
    sVar10 = std::
             multimap<unsigned_char,_std::pair<int,_int>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::pair<int,_int>_>_>_>
             ::size(&this->Open);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,sVar10);
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    local_128 = (_Base_ptr)
                std::
                multimap<unsigned_char,_std::pair<int,_int>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::pair<int,_int>_>_>_>
                ::begin(&this->Open);
    xy.second = 1;
    neighbors.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)local_128;
    while( true ) {
      local_130._M_node =
           (_Base_ptr)
           std::
           multimap<unsigned_char,_std::pair<int,_int>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::pair<int,_int>_>_>_>
           ::end(&this->Open);
      bVar4 = std::operator!=((_Self *)&neighbors.
                                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              &local_130);
      if (!bVar4) break;
      poVar9 = std::operator<<((ostream *)&std::cout,"Edge ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,xy.second);
      poVar9 = std::operator<<(poVar9,": (");
      ppVar11 = std::_Rb_tree_iterator<std::pair<const_unsigned_char,_std::pair<int,_int>_>_>::
                operator->((_Rb_tree_iterator<std::pair<const_unsigned_char,_std::pair<int,_int>_>_>
                            *)&neighbors.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
      poVar9 = std::operator<<(poVar9,ppVar11->first);
      poVar9 = std::operator<<(poVar9,") => (");
      ppVar11 = std::_Rb_tree_iterator<std::pair<const_unsigned_char,_std::pair<int,_int>_>_>::
                operator->((_Rb_tree_iterator<std::pair<const_unsigned_char,_std::pair<int,_int>_>_>
                            *)&neighbors.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,(ppVar11->second).first);
      poVar9 = std::operator<<(poVar9,", ");
      ppVar11 = std::_Rb_tree_iterator<std::pair<const_unsigned_char,_std::pair<int,_int>_>_>::
                operator->((_Rb_tree_iterator<std::pair<const_unsigned_char,_std::pair<int,_int>_>_>
                            *)&neighbors.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,(ppVar11->second).second);
      std::operator<<(poVar9,")\n");
      std::_Rb_tree_iterator<std::pair<const_unsigned_char,_std::pair<int,_int>_>_>::operator++
                ((_Rb_tree_iterator<std::pair<const_unsigned_char,_std::pair<int,_int>_>_> *)
                 &neighbors.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,0);
      xy.second = xy.second + 1;
    }
  }
  while( true ) {
    bVar4 = std::
            multimap<unsigned_char,_std::pair<int,_int>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::pair<int,_int>_>_>_>
            ::empty(&this->Open);
    local_2a1 = 1;
    if (bVar4) {
      bVar4 = std::
              queue<std::pair<int,_int>,_std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              ::empty(&this->Pit);
      local_2a1 = bVar4 ^ 0xff;
    }
    if ((local_2a1 & 1) == 0) break;
    bVar4 = std::
            queue<std::pair<int,_int>,_std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
            ::empty(&this->Pit);
    if (bVar4) {
      PrioPop(this,&this->Open,(XY_t *)&it);
    }
    else {
      __p = std::
            queue<std::pair<int,_int>,_std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
            ::front(&this->Pit);
      std::pair<int,_int>::operator=((pair<int,_int> *)&it,__p);
      std::
      queue<std::pair<int,_int>,_std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
      ::pop(&this->Pit);
    }
    if (this->verbose != 0) {
      poVar9 = std::operator<<((ostream *)&std::cerr,"Processing cell (");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,(int)it._M_node);
      poVar9 = std::operator<<(poVar9,',');
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,it._M_node._4_4_);
      poVar9 = std::operator<<(poVar9,"), elevation= ");
      poVar9 = (ostream *)
               std::ostream::operator<<(poVar9,(double)this->dem[(int)it._M_node][it._M_node._4_4_])
      ;
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    }
    XVar13.second = it._M_node._4_4_;
    XVar13.first = (int)it._M_node;
    BVar5 = isWithin(this,XVar13);
    if (BVar5) {
      if (this->verbose != 0) {
        poVar9 = std::operator<<((ostream *)&std::cerr,"\tCell is within the DEM.");
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      }
      xy_00.second = it._M_node._4_4_;
      xy_00.first = (int)it._M_node;
      BVar5 = neighborsOf(this,xy_00,
                          (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          local_48);
      if (BVar5) {
        if (this->verbose != 0) {
          poVar9 = std::operator<<((ostream *)&std::cerr,"\tCell has ");
          sVar12 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                             ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                              local_48);
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,sVar12);
          poVar9 = std::operator<<(poVar9," neighbors.");
          std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        }
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
                  ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&nit,
                   (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_48);
        XVar13 = miNeighbors(this,(vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   *)&nit);
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
                  ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&nit);
        if (this->verbose != 0) {
          poVar9 = std::operator<<((ostream *)&std::cerr,"\tNeighbor with minimal elevation is (");
          local_150 = XVar13.first;
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_150);
          poVar9 = std::operator<<(poVar9,',');
          iStack_14c = XVar13.second;
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,iStack_14c);
          poVar9 = std::operator<<(poVar9,"), whose elevation is ");
          poVar9 = std::operator<<(poVar9,this->dem[local_150][iStack_14c]);
          poVar9 = std::operator<<(poVar9,".");
          std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        }
        if (this->verbose != 0) {
          poVar9 = std::operator<<((ostream *)&std::cerr,"\tFor all neighbors, do:");
          std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        }
        local_170._M_current =
             (pair<int,_int> *)
             std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                       ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                        local_48);
        while( true ) {
          n = (XY_t)std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *
                               )local_48);
          bVar4 = __gnu_cxx::operator!=
                            (&local_170,
                             (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                              *)&n);
          if (!bVar4) break;
          ppVar14 = __gnu_cxx::
                    __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                    ::operator*(&local_170);
          local_188.first = ppVar14->first;
          local_188.second = ppVar14->second;
          local_180 = local_188;
          BVar5 = isClosed(this,local_188);
          if (BVar5) {
            if (this->verbose != 0) {
              poVar9 = std::operator<<((ostream *)&std::cerr,"\t\tNeighbor (");
              poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_180.first);
              poVar9 = std::operator<<(poVar9,',');
              poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_180.second);
              poVar9 = std::operator<<(poVar9,") has been already ");
              poVar9 = std::operator<<(poVar9,"encountered -- ignoring it.");
              std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
            }
          }
          else {
            if (this->verbose != 0) {
              poVar9 = std::operator<<((ostream *)&std::cerr,"\t\tProcessing neighbor (");
              poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_180.first);
              poVar9 = std::operator<<(poVar9,',');
              poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_180.second);
              poVar9 = std::operator<<(poVar9,"):");
              std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
              poVar9 = std::operator<<((ostream *)&std::cerr,
                                       "\t\t\tCalculating max(current neighbor, popped cell), i.e. max(dem["
                                      );
              poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_180.first);
              poVar9 = std::operator<<(poVar9,"][");
              poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_180.second);
              poVar9 = std::operator<<(poVar9,"], dem[");
              poVar9 = (ostream *)std::ostream::operator<<(poVar9,(int)it._M_node);
              poVar9 = std::operator<<(poVar9,"][");
              poVar9 = (ostream *)std::ostream::operator<<(poVar9,it._M_node._4_4_);
              poVar9 = std::operator<<(poVar9,"]) = ");
              poVar9 = std::operator<<(poVar9,"max(");
              poVar9 = std::operator<<(poVar9,this->dem[local_180.first][local_180.second]);
              poVar9 = std::operator<<(poVar9,", ");
              poVar9 = std::operator<<(poVar9,this->dem[(int)it._M_node][it._M_node._4_4_]);
              poVar9 = std::operator<<(poVar9,") = ");
              puVar15 = std::max<unsigned_char>
                                  (this->dem[local_180.first] + local_180.second,
                                   this->dem[(int)it._M_node] + it._M_node._4_4_);
              poVar9 = std::operator<<(poVar9,*puVar15);
              std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
              poVar9 = std::operator<<((ostream *)&std::cerr,"\t\t\tElevating cell (");
              poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_180.first);
              poVar9 = std::operator<<(poVar9,',');
              poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_180.second);
              poVar9 = std::operator<<(poVar9,") from ");
              poVar9 = std::operator<<(poVar9,this->dem[local_180.first][local_180.second]);
              poVar9 = std::operator<<(poVar9," to ");
              puVar15 = std::max<unsigned_char>
                                  (this->dem[local_180.first] + local_180.second,
                                   this->dem[(int)it._M_node] + it._M_node._4_4_);
              poVar9 = std::operator<<(poVar9,*puVar15);
              std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
            }
            this->Closed[local_180.first][local_180.second] = true;
            if (this->dem[(int)it._M_node][it._M_node._4_4_] <
                this->dem[local_180.first][local_180.second]) {
              if (this->verbose != 0) {
                poVar9 = std::operator<<((ostream *)&std::cerr,"\t\t\tPush cell (");
                poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_180.first);
                poVar9 = std::operator<<(poVar9,',');
                poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_180.second);
                poVar9 = std::operator<<(poVar9,") onto stack Open with priority ");
                poVar9 = std::operator<<(poVar9,this->dem[local_180.first][local_180.second]);
                std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
              }
              ppuVar2 = this->dem;
              ppVar16 = __gnu_cxx::
                        __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                        ::operator->(&local_170);
              puVar15 = ppuVar2[ppVar16->first];
              ppVar16 = __gnu_cxx::
                        __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                        ::operator->(&local_170);
              iVar1 = ppVar16->second;
              ppVar14 = __gnu_cxx::
                        __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                        ::operator*(&local_170);
              std::pair<double,_std::pair<int,_int>_>::
              pair<unsigned_char_&,_std::pair<int,_int>_&,_true>(&local_198,puVar15 + iVar1,ppVar14)
              ;
              std::
              multimap<unsigned_char,std::pair<int,int>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
              ::insert<std::pair<double,std::pair<int,int>>>
                        ((multimap<unsigned_char,std::pair<int,int>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
                          *)&this->Open,&local_198);
            }
            else {
              this->dem[local_180.first][local_180.second] =
                   this->dem[(int)it._M_node][it._M_node._4_4_];
              if (this->verbose != 0) {
                poVar9 = std::operator<<((ostream *)&std::cerr,"\t\t\tPush cell (");
                poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_180.first);
                poVar9 = std::operator<<(poVar9,',');
                poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_180.second);
                poVar9 = std::operator<<(poVar9,") onto queue Pit");
                std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
              }
              std::
              queue<std::pair<int,_int>,_std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              ::push(&this->Pit,&local_180);
            }
          }
          __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator++(&local_170,0);
        }
      }
      else if (this->verbose != 0) {
        poVar9 = std::operator<<((ostream *)&std::cerr,"\tCell has no neighbors.");
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      }
    }
    else if (this->verbose != 0) {
      poVar9 = std::operator<<((ostream *)&std::cerr,
                               "\tIgnoring the cell, as it is not within the DEM.");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    }
  }
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_48);
  return true;
}

Assistant:

Boolean GSFloodFill<T>::Transform() {
	int i, j;
	XY_t xy, c;
	PrIterator_t it;
	vector<XY_t> neighbors;

	 /////////////// 
	// Algorithm 2 //
	 ///////////////

	// Let Closed have the same dimensions as DEM
	// Let Closed be initialized to false
	Closed = new Boolean* [rows];
	for (i=0; i<rows; i++) {
		Closed[i] = new Boolean [cols];
		for (j=0; j<cols; j++) {
			Closed[i][j] = false;
		}
	}

	if (rows == 1) { // monodimensional case
		xy = pair<int,int>(0, 0);
		Open.insert(pair<T,XY_t>(dem[0][0], xy));
		Closed[0][0] = true;
		xy = pair<int,int>(0, cols-1);
		Open.insert(pair<T,XY_t>(dem[0][cols-1], xy));
		Closed[0][cols-1] = true;
	} else {		// bidimensional case
		// for all edges of DEM do
		for (j=0; j<cols; j++) {
			xy = pair<int,int>(0, j);
			Open.insert(pair<T,XY_t>(dem[0][j], xy));
			Closed[0][j] = true;
			xy = pair<int,int>(rows-1, j);
			Open.insert(pair<T,XY_t>(dem[rows-1][j], xy));
			Closed[rows-1][j] = true;
		}
		for (i=1; i<rows-1; i++) {
			xy = pair<int,int>(i, 0);
			Open.insert(pair<T,XY_t>(dem[i][0], xy));
			Closed[i][0] = true;
			xy = pair<int,int>(i,cols-1);
			Open.insert(pair<T,XY_t>(dem[i][cols-1], xy));
			Closed[i][cols-1] = true;
		}
	}

	if (verbose) {
		std::cout << "Number of edges: " << Open.size() << std::endl;
		for (it=Open.begin(), i=1; it != Open.end(); it++, i++)
				std::cout << "Edge " << i << ": (" << it->first << ") => (" << it->second.first
					<< ", " << it->second.second << ")\n";
	}



	// while either Open or Pit is not empty do
	while ( ! Open.empty() || ! Pit.empty() ) {
		if ( ! Pit.empty() ) {
			c=Pit.front();
			Pit.pop();
		} else {
			PrioPop(Open,c);
		}

		// An edge was found on either Open or Pit
		if (verbose)
			std::cerr << "Processing cell (" << c.first << ',' << c.second << "), elevation= " << (Real) dem[c.first][c.second]  << std::endl;
		
		if (! isWithin(c)) {
			if (verbose)
				std::cerr << "\tIgnoring the cell, as it is not within the DEM." << std::endl;
			continue;
		}

		// The edge is within the DEM
		if (verbose)
			std::cerr << "\tCell is within the DEM." << std::endl;

		// neighbors lists the neighbors of c
		if (! neighborsOf(c, neighbors)) {
			if (verbose)
				std::cerr << "\tCell has no neighbors." << std::endl;
			continue;
		}
		// Here, neighbors contains the neighbors of c
		if (verbose)
			std::cerr << "\tCell has " << neighbors.size() << " neighbors." << std::endl;
		

		// miNeighbor is the coordinates of the cell with minimal elevation
		XY_t miNeighbor = miNeighbors(neighbors);
		if (verbose)
			std::cerr << "\tNeighbor with minimal elevation is (" << miNeighbor.first << ',' << miNeighbor.second
				 << "), whose elevation is " << dem[miNeighbor.first][miNeighbor.second] << "." << std::endl;

		
		if (verbose)
			std::cerr << "\tFor all neighbors, do:" << std::endl;



		for (vector<XY_t>::iterator nit = neighbors.begin(); nit != neighbors.end(); nit++) {
			XY_t n = *nit;

			if (isClosed(n)) {
				if (verbose)
					std::cerr << "\t\tNeighbor (" << n.first << ',' << n.second << ") has been already "
					<< "encountered -- ignoring it." << std::endl;

				continue;
			}

			if (verbose) {
				std::cerr << "\t\tProcessing neighbor (" << n.first << ',' << n.second << "):" << std::endl;

				std::cerr << "\t\t\tCalculating max(current neighbor, popped cell), i.e. max(dem[" 
					<< n.first << "][" << n.second << "], dem[" << c.first << "][" << c.second << "]) = "
					<< "max(" << dem[n.first][n.second] << ", " << dem[c.first][c.second] << ") = "
					<< std::max(dem[n.first][n.second], dem[c.first][c.second]) << std::endl;

				std::cerr << "\t\t\tElevating cell (" << n.first << ',' << n.second << ") from " << dem[n.first][n.second]
					<< " to " << std::max(dem[n.first][n.second], dem[c.first][c.second]) << std::endl;
			}

			Closed[n.first][n.second] = true;

			if (dem[n.first][n.second] <= dem[c.first][c.second]) {
				dem[n.first][n.second] = dem[c.first][c.second];

				if (verbose)
					std::cerr << "\t\t\tPush cell (" << n.first << ',' << n.second << ") onto queue Pit" << std::endl;

				Pit.push(n);
			} else {
				if (verbose)
					std::cerr << "\t\t\tPush cell (" << n.first << ',' << n.second << ") onto stack Open with priority "
						<< dem[n.first][n.second] << std::endl;

				// Push n onto Open with priority DEM(n)
				Open.insert(pair<Real,XY_t>(dem[nit->first][nit->second], *nit));
			}
		}
	}

	return true;
}